

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalDependency::LogicalDependency
          (LogicalDependency *this,optional_ptr<duckdb::Catalog,_true> catalog_p,
          CatalogEntryInfo *entry_p,string *catalog_str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  optional_ptr<duckdb::Catalog,_true> local_28;
  
  (this->entry).type = entry_p->type;
  paVar4 = &(this->entry).schema.field_2;
  (this->entry).schema._M_dataplus._M_p = (pointer)paVar4;
  pcVar2 = (entry_p->schema)._M_dataplus._M_p;
  paVar1 = &(entry_p->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&(entry_p->schema).field_2 + 8);
    paVar4->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->entry).schema.field_2 + 8) = uVar3;
  }
  else {
    (this->entry).schema._M_dataplus._M_p = pcVar2;
    (this->entry).schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->entry).schema._M_string_length = (entry_p->schema)._M_string_length;
  (entry_p->schema)._M_dataplus._M_p = (pointer)paVar1;
  (entry_p->schema)._M_string_length = 0;
  (entry_p->schema).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->entry).name.field_2;
  (this->entry).name._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (entry_p->name)._M_dataplus._M_p;
  paVar4 = &(entry_p->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(entry_p->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->entry).name.field_2 + 8) = uVar3;
  }
  else {
    (this->entry).name._M_dataplus._M_p = pcVar2;
    (this->entry).name.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->entry).name._M_string_length = (entry_p->name)._M_string_length;
  (entry_p->name)._M_dataplus._M_p = (pointer)paVar4;
  (entry_p->name)._M_string_length = 0;
  (entry_p->name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->catalog).field_2;
  (this->catalog)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (catalog_str->_M_dataplus)._M_p;
  paVar4 = &catalog_str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&catalog_str->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->catalog).field_2 + 8) = uVar3;
  }
  else {
    (this->catalog)._M_dataplus._M_p = pcVar2;
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->catalog)._M_string_length = catalog_str->_M_string_length;
  (catalog_str->_M_dataplus)._M_p = (pointer)paVar4;
  catalog_str->_M_string_length = 0;
  (catalog_str->field_2)._M_local_buf[0] = '\0';
  if (catalog_p.ptr != (Catalog *)0x0) {
    local_28.ptr = catalog_p.ptr;
    optional_ptr<duckdb::Catalog,_true>::CheckValid(&local_28);
    ::std::__cxx11::string::_M_assign((string *)&this->catalog);
  }
  return;
}

Assistant:

LogicalDependency::LogicalDependency(optional_ptr<Catalog> catalog_p, CatalogEntryInfo entry_p, string catalog_str)
    : entry(std::move(entry_p)), catalog(std::move(catalog_str)) {
	if (catalog_p) {
		catalog = catalog_p->GetName();
	}
}